

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint uVar1;
  PgHdr1 *pPage;
  ulong uVar2;
  PgHdr1 **ppPVar3;
  ulong uVar4;
  
  uVar1 = pCache->nHash;
  if (pCache->iMaxKey - iLimit < uVar1) {
    uVar2 = (ulong)iLimit % (ulong)uVar1;
    uVar4 = (ulong)pCache->iMaxKey % (ulong)uVar1;
  }
  else {
    uVar4 = (ulong)((uVar1 >> 1) - 1);
    uVar2 = (ulong)(uVar1 >> 1);
  }
  while( true ) {
    ppPVar3 = pCache->apHash + uVar2;
    while (pPage = *ppPVar3, pPage != (PgHdr1 *)0x0) {
      if (pPage->iKey < iLimit) {
        ppPVar3 = &pPage->pNext;
      }
      else {
        pCache->nPage = pCache->nPage - 1;
        *ppPVar3 = pPage->pNext;
        if (pPage->pLruNext != (PgHdr1 *)0x0) {
          pcache1PinPage(pPage);
        }
        pcache1FreePage(pPage);
      }
    }
    if ((int)uVar2 == (int)uVar4) break;
    uVar2 = (ulong)((int)uVar2 + 1) % (ulong)pCache->nHash;
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h, iStop;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  assert( pCache->iMaxKey >= iLimit );
  assert( pCache->nHash > 0 );
  if( pCache->iMaxKey - iLimit < pCache->nHash ){
    /* If we are just shaving the last few pages off the end of the
    ** cache, then there is no point in scanning the entire hash table.
    ** Only scan those hash slots that might contain pages that need to
    ** be removed. */
    h = iLimit % pCache->nHash;
    iStop = pCache->iMaxKey % pCache->nHash;
    TESTONLY( nPage = -10; )  /* Disable the pCache->nPage validity check */
  }else{
    /* This is the general case where many pages are being removed.
    ** It is necessary to scan the entire hash table */
    h = pCache->nHash/2;
    iStop = h - 1;
  }
  for(;;){
    PgHdr1 **pp;
    PgHdr1 *pPage;
    assert( h<pCache->nHash );
    pp = &pCache->apHash[h]; 
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( PAGE_IS_UNPINNED(pPage) ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( if( nPage>=0 ) nPage++; )
      }
    }
    if( h==iStop ) break;
    h = (h+1) % pCache->nHash;
  }
  assert( nPage<0 || pCache->nPage==(unsigned)nPage );
}